

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O1

int GeoIP_id_by_ipnum_v6(GeoIP *gi,geoipv6_t ipnum)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  bVar1 = gi->databaseType;
  if ((bVar1 < 0xd) && ((0x1500U >> (bVar1 & 0x1f) & 1) != 0)) {
    uVar2 = _GeoIP_seek_record_v6(gi,ipnum);
    iVar3 = uVar2 - 0xffff00;
  }
  else {
    iVar3 = 0;
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[(char)bVar1],
           GeoIPDBDescription[0xc]);
  }
  return iVar3;
}

Assistant:

int GeoIP_id_by_ipnum_v6 (GeoIP* gi, geoipv6_t ipnum) {
       int ret;
/*     if (ipnum == 0) {
               return 0;
       }
*/     
       if (gi->databaseType != GEOIP_COUNTRY_EDITION_V6 && 
                       gi->databaseType != GEOIP_PROXY_EDITION &&
                       gi->databaseType != GEOIP_NETSPEED_EDITION) {
               printf("Invalid database type %s, expected %s\n",
                                        GeoIPDBDescription[(int)gi->databaseType],
                                        GeoIPDBDescription[GEOIP_COUNTRY_EDITION_V6]);
               return 0;
       }
       ret = _GeoIP_seek_record_v6(gi, ipnum) - COUNTRY_BEGIN;
       return ret;
}